

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O3

char16_t * PAL_wcsncat(char16_t *strDest,char16_t *strSource,size_t count)

{
  char16_t *pcVar1;
  long lVar2;
  char16_t *pcVar3;
  char16_t cVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (strSource == (char16_t *)0x0 || strDest == (char16_t *)0x0) {
    strDest = (char16_t *)0x0;
  }
  else {
    pcVar3 = strDest + -1;
    do {
      pcVar1 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar1 != L'\0');
    cVar4 = *strSource;
    if (cVar4 != L'\0') {
      uVar5 = 0;
      do {
        lVar2 = uVar5 + 1;
        uVar5 = uVar5 + 1;
      } while (strSource[lVar2] != L'\0');
      if ((uVar5 & 0xffffffff) < count) {
        count = uVar5 & 0xffffffff;
      }
      if (count != 0) {
        uVar5 = 1;
        do {
          *pcVar3 = cVar4;
          pcVar3 = pcVar3 + 1;
          cVar4 = strSource[uVar5];
          if (cVar4 == L'\0') break;
          uVar6 = uVar5 & 0xffffffff;
          uVar5 = uVar5 + 1;
        } while (uVar6 < count);
      }
    }
    *pcVar3 = L'\0';
  }
  return strDest;
}

Assistant:

char16_t *
__cdecl
PAL_wcsncat( char16_t * strDest, const char16_t *strSource, size_t count )
{
    char16_t *start = strDest;
    UINT LoopCount = 0;
    UINT StrSourceLength = 0;

    PERF_ENTRY(wcsncat);
    ENTRY( "wcsncat (strDestination=%p (%S), strSource=%p (%S), count=%lu )\n",
            strDest ? strDest : W16_NULLSTRING,
            strDest ? strDest : W16_NULLSTRING,
            strSource ? strSource : W16_NULLSTRING,
            strSource ? strSource : W16_NULLSTRING, (unsigned long) count);

    if ( strDest == NULL )
    {
        ERROR("invalid strDest argument\n");
        LOGEXIT("wcsncat returning char16_t NULL\n");
        PERF_EXIT(wcsncat);
        return NULL;
    }

    if ( strSource == NULL )
    {
        ERROR("invalid strSource argument\n");
        LOGEXIT("wcsncat returning char16_t NULL\n");
        PERF_EXIT(wcsncat);
        return NULL;
    }

    /* find end of source string */
    while ( *strDest )
    {
        strDest++;
    }

    StrSourceLength = PAL_wcslen( strSource );
    if ( StrSourceLength < count )
    {
        count = StrSourceLength;
    }

    /* concatenate new string */
    while( *strSource && LoopCount < count )
    {
      *strDest++ = *strSource++;
      LoopCount++;
    }

    /* add terminating null */
    *strDest = '\0';

    LOGEXIT("wcsncat returning char16_t %p (%S)\n", start, start);
    PERF_EXIT(wcsncat);
    return start;
}